

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

void __thiscall Population::calcDiversity(Population *this)

{
  pointer pCVar1;
  pointer pTVar2;
  pointer pTVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (pCVar1->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = *(pointer *)
            ((long)&(pCVar1->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                    _M_impl + 8);
  lVar8 = (long)pTVar3 - (long)pTVar2 >> 2;
  uVar5 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) *
          -0x5555555555555555;
  iVar4 = (int)uVar5;
  if ((uVar5 & 0xffffffff) == 0) {
    dVar14 = 0.0;
  }
  else {
    uVar7 = (ulong)iVar4;
    lVar9 = 0;
    uVar11 = 0;
    do {
      uVar12 = uVar11 + 1;
      if (uVar12 < uVar7) {
        uVar10 = uVar12;
        do {
          if (pTVar3 != pTVar2) {
            lVar6 = 0;
            do {
              lVar9 = lVar9 + (ulong)(*(int *)(*(long *)&pCVar1[uVar11].turnList.
                                                                                                                  
                                                  super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>
                                                  ._M_impl.super__Vector_impl_data + lVar6 * 4) !=
                                     *(int *)(*(long *)&pCVar1[uVar10].turnList.
                                                                                                                
                                                  super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>
                                                  ._M_impl.super__Vector_impl_data + lVar6 * 4));
              lVar6 = lVar6 + 1;
            } while (lVar8 + (ulong)(lVar8 == 0) != lVar6);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar7);
      }
      uVar11 = uVar12;
    } while (uVar12 != uVar7 + (uVar7 == 0));
    auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = 0x45300000;
    dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
  }
  lVar8 = lVar8 * (int)(((uint)(iVar4 * iVar4) >> 1) -
                       ((int)(((uint)(uVar5 >> 0x1f) & 1) + iVar4) >> 1));
  auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar16._0_8_ = lVar8;
  auVar16._12_4_ = 0x45300000;
  fVar13 = roundf((float)(dVar14 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)))
                  * 100.0);
  this->diversity = fVar13;
  return;
}

Assistant:

void Population::calcDiversity() {


    size_t orientationCount = chromosomes.front().turnList.size();

    int populationSize = (int) chromosomes.size();

    uint64_t sum = 0;

    for (size_t i = 0; i < populationSize; ++i)
    {
        for (size_t j = i + 1; j < populationSize; ++j)
        {
            const Chromosome & c1 = chromosomes[i];
            const Chromosome & c2 = chromosomes[j];

            for (size_t pos = 0; pos < orientationCount; ++pos)
            {
                if (c1.turnList[pos] != c2.turnList[pos])
                {
                    ++sum;
                }
            }
        }
    };

    uint64_t numComparisons = (uint64_t) ((populationSize * populationSize / 2) - (populationSize / 2));

    uint64_t total = numComparisons * orientationCount;

    diversity = static_cast<float>(static_cast<double>(sum) / total);
    diversity *= 100.0f;

    diversity = std::roundf(diversity);

}